

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

Optional<Corrade::Utility::JsonView<Corrade::Utility::JsonObjectItem>_> * __thiscall
Corrade::Utility::Json::parseObject
          (Optional<Corrade::Utility::JsonView<Corrade::Utility::JsonObjectItem>_>
           *__return_storage_ptr__,Json *this,JsonToken *token)

{
  bool bVar1;
  State *pSVar2;
  JsonToken *pJVar3;
  size_t sVar4;
  ostream *output;
  Type TVar5;
  Debug *pDVar6;
  JsonView<Corrade::Utility::JsonObjectItem> local_d8;
  JsonToken *local_c0;
  JsonToken *iMax;
  JsonToken *i;
  size_t childCount;
  BasicStringView<const_char> local_a0;
  Flags local_89;
  undefined1 local_88 [8];
  Error err;
  Flags local_49;
  Error local_48;
  JsonToken *local_20;
  JsonToken *token_local;
  Json *this_local;
  
  local_20 = token;
  token_local = (JsonToken *)this;
  this_local = (Json *)__return_storage_ptr__;
  pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  pJVar3 = Containers::Array::operator_cast_to_JsonToken_((Array *)&pSVar2->tokens);
  pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  sVar4 = Containers::
          Array<Corrade::Utility::JsonToken,_void_(*)(Corrade::Utility::JsonToken_*,_unsigned_long)>
          ::size(&pSVar2->tokens);
  if (sVar4 <= (ulong)(((long)token - (long)pJVar3) / 0x18)) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_49);
    Error::Error(&local_48,output,local_49);
    Debug::operator<<(&local_48.super_Debug,
                      "Utility::Json::parseObject(): token not owned by the instance");
    Error::~Error(&local_48);
    abort();
  }
  TVar5 = JsonToken::type(local_20);
  if (TVar5 == Object) {
    parseObjectArrayInternal(this,local_20);
    i = (JsonToken *)JsonToken::childCount(local_20);
    iMax = local_20 + 1;
    local_c0 = iMax + (long)i;
    for (; iMax != local_c0; iMax = JsonToken::next(iMax)) {
      bVar1 = parseStringInternal(this,"Utility::Json::parseObject():",iMax);
      if (!bVar1) {
        Containers::Optional<Corrade::Utility::JsonView<Corrade::Utility::JsonObjectItem>_>::
        Optional(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
    }
    JsonView<Corrade::Utility::JsonObjectItem>::JsonView
              (&local_d8,local_20 + 1,local_20 + (long)((long)&i->_data + 1));
    Containers::Optional<Corrade::Utility::JsonView<Corrade::Utility::JsonObjectItem>_>::Optional
              (__return_storage_ptr__,&local_d8);
  }
  else {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_89);
    Error::Error((Error *)local_88,local_89);
    pDVar6 = Debug::operator<<((Debug *)local_88,
                               "Utility::Json::parseObject(): expected an object, got");
    TVar5 = JsonToken::type(local_20);
    pDVar6 = Utility::operator<<(pDVar6,TVar5);
    Debug::operator<<(pDVar6,"at");
    pSVar2 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
    local_a0 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                         (&pSVar2->string,local_20->_data);
    printFilePosition(this,(Debug *)local_88,local_a0);
    Containers::Optional<Corrade::Utility::JsonView<Corrade::Utility::JsonObjectItem>_>::Optional
              (__return_storage_ptr__);
    Error::~Error((Error *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<JsonObjectView> Json::parseObject(const JsonToken& token) {
    CORRADE_ASSERT(std::size_t(&token - _state->tokens) < _state->tokens.size(),
        "Utility::Json::parseObject(): token not owned by the instance", {});

    if(token.type() != JsonToken::Type::Object) {
        Error err;
        err << "Utility::Json::parseObject(): expected an object, got" << token.type() << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }

    parseObjectArrayInternal(const_cast<JsonToken&>(token));

    const std::size_t childCount = token.childCount();
    for(JsonToken *i = const_cast<JsonToken*>(&token) + 1, *iMax = i + childCount; i != iMax; i = const_cast<JsonToken*>(i->next())) {
        if(!parseStringInternal("Utility::Json::parseObject():", *i)) return {};
    }

    return JsonObjectView{&token + 1, &token + 1 + childCount};
}